

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,
          back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *it)

{
  add_thousands_sep<wchar_t> sep;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar1;
  uint uStack_c;
  
  sep.sep_.size_ = 1;
  sep.sep_.data_ = (wchar_t *)(this + 0xc);
  sep._16_8_ = (ulong)uStack_c << 0x20;
  bVar1 = internal::
          format_decimal<wchar_t,unsigned_long,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,fmt::v5::internal::add_thousands_sep<wchar_t>>
                    ((back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>)
                     it->container,*(unsigned_long *)this,*(int *)(this + 8),sep);
  it->container = (vector<wchar_t,_std::allocator<wchar_t>_> *)bVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }